

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ParseUri(char *zDefaultVfs,char *zUri,uint *pFlags,sqlite3_vfs **ppVfs,char **pzFile,
                   char **pzErrMsg)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  char *__s;
  sqlite3_vfs *psVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  byte bVar14;
  ulong n;
  char *__s_00;
  uint uVar15;
  int *__s_01;
  OpenMode *pOVar16;
  char *local_68;
  uint local_58;
  uint local_54;
  
  uVar10 = *pFlags;
  if (zUri == (char *)0x0) {
    uVar15 = 0;
  }
  else {
    sVar5 = strlen(zUri);
    uVar15 = (uint)sVar5 & 0x3fffffff;
  }
  if ((uVar15 < 5 || (uVar10 & 0x40) == 0 && sqlite3Config.bOpenUri == 0) ||
     (zUri[4] != ':' || *(int *)zUri != 0x656c6966)) {
    iVar4 = sqlite3_initialize();
    if (iVar4 != 0) {
      return 7;
    }
    __s = (char *)sqlite3Malloc((ulong)(uVar15 + 2));
    if (__s == (char *)0x0) {
      return 7;
    }
    if (uVar15 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = (ulong)uVar15;
      memcpy(__s,zUri,uVar9);
    }
    (__s + uVar9)[0] = '\0';
    (__s + uVar9)[1] = '\0';
    uVar10 = uVar10 & 0xffffffbf;
    goto LAB_00252047;
  }
  n = (ulong)(uVar15 + 2);
  uVar9 = 0;
  do {
    n = n + (zUri[uVar9] == '&');
    uVar9 = uVar9 + 1;
  } while (uVar15 != uVar9);
  iVar4 = sqlite3_initialize();
  if (iVar4 != 0) {
    return 7;
  }
  __s = (char *)sqlite3Malloc(n);
  if (__s == (char *)0x0) {
    return 7;
  }
  uVar10 = uVar10 | 0x40;
  uVar9 = 5;
  if ((zUri[5] != '/') || (zUri[6] != '/')) {
LAB_002520a4:
    iVar11 = 0;
    iVar4 = 0;
    do {
      lVar12 = (long)iVar4;
      uVar9 = uVar9 & 0xffffffff;
LAB_002520b5:
      uVar15 = (uint)uVar9;
      bVar14 = zUri[(int)uVar15];
      if ((bVar14 == 0) || (bVar14 == 0x23)) {
        if (iVar11 == 1) {
          __s[lVar12] = '\0';
          lVar12 = (long)(iVar4 + 1);
        }
        (__s + lVar12)[0] = '\0';
        (__s + lVar12)[1] = '\0';
        sVar5 = strlen(__s);
        uVar9 = (ulong)((uint)sVar5 & 0x3fffffff);
        if (__s[uVar9 + 1] == '\0') goto LAB_00252047;
        __s_01 = (int *)(__s + uVar9 + 1);
        local_68 = zDefaultVfs;
        goto LAB_0025226c;
      }
      uVar13 = uVar15 + 1;
      uVar9 = (ulong)uVar13;
      if (((bVar14 == 0x25) && (bVar1 = zUri[(int)uVar13], (""[bVar1] & 8) != 0)) &&
         (bVar2 = zUri[(long)(int)uVar15 + 2], (""[bVar2] & 8) != 0)) {
        uVar9 = (ulong)(uVar15 + 3);
        bVar14 = ((char)(bVar2 * '\x02') >> 7 & 9U) + bVar2 & 0xf |
                 (((char)(bVar1 * '\x02') >> 7 & 9U) + bVar1) * '\x10';
        if (bVar14 != 0) goto LAB_002521dd;
        for (pcVar7 = zUri + (int)(uVar15 + 3);
            ((cVar3 = *pcVar7, cVar3 != '\0' && (cVar3 != '#')) && ((iVar11 != 0 || (cVar3 != '?')))
            ); pcVar7 = pcVar7 + 1) {
          if (iVar11 == 1) {
            if ((cVar3 == '&') || (cVar3 == '=')) break;
          }
          else if ((iVar11 == 2) && (cVar3 == '&')) break;
          uVar9 = (ulong)((int)uVar9 + 1);
        }
        goto LAB_002520b5;
      }
      if (iVar11 != 1) {
        if (((iVar11 != 0) || (bVar14 != 0x3f)) && ((iVar11 != 2 || (bVar14 != 0x26))))
        goto LAB_002521dd;
LAB_00252212:
        iVar11 = 1;
        goto LAB_00252225;
      }
      if ((bVar14 != 0x3d) && (bVar14 != 0x26)) {
        iVar11 = 1;
        goto LAB_002521dd;
      }
      if (__s[lVar12 + -1] == '\0') {
        pcVar7 = zUri + (int)uVar13;
        while( true ) {
          uVar15 = uVar15 + 1;
          uVar9 = (ulong)uVar15;
          iVar11 = 1;
          if (((*pcVar7 == '\0') || (*pcVar7 == '#')) || (pcVar7[-1] == '&')) break;
          pcVar7 = pcVar7 + 1;
        }
        goto LAB_002520b5;
      }
      if (bVar14 == 0x26) {
        iVar4 = iVar4 + 1;
        __s[lVar12] = '\0';
        lVar12 = (long)iVar4;
        goto LAB_00252212;
      }
      iVar11 = 2;
LAB_00252225:
      bVar14 = 0;
LAB_002521dd:
      iVar4 = iVar4 + 1;
      __s[lVar12] = bVar14;
    } while( true );
  }
  for (lVar12 = 0; (zUri[lVar12 + 7] != '\0' && (zUri[lVar12 + 7] != '/')); lVar12 = lVar12 + 1) {
  }
  uVar9 = lVar12 + 7;
  if ((int)uVar9 == 0x10) {
    if (zUri[0xf] == 't' && *(long *)(zUri + 7) == 0x736f686c61636f6c) {
      uVar9 = 0x10;
      goto LAB_002520a4;
    }
  }
  else if ((int)uVar9 == 7) goto LAB_002520a4;
  pcVar7 = sqlite3_mprintf("invalid uri authority: %.*s",lVar12,zUri + 7);
  goto LAB_0025206f;
LAB_0025226c:
  do {
    sVar5 = strlen((char *)__s_01);
    uVar13 = (uint)sVar5 & 0x3fffffff;
    pcVar7 = (char *)((long)__s_01 + (ulong)uVar13 + 1);
    sVar5 = strlen(pcVar7);
    uVar15 = (uint)sVar5;
    if (uVar13 == 5) {
      if ((char)__s_01[1] == 'e' && *__s_01 == 0x68636163) {
        local_54 = 0x60000;
        local_58 = 0xfff9ffff;
        pOVar16 = sqlite3ParseUri::aCacheMode;
        pcVar8 = "cache";
LAB_0025233f:
        __s_00 = pOVar16->z;
        if (__s_00 != (char *)0x0) {
          while( true ) {
            sVar5 = strlen(__s_00);
            if (((((uint)sVar5 ^ uVar15) & 0x3fffffff) == 0) &&
               (iVar4 = bcmp(pcVar7,__s_00,(ulong)(uVar15 & 0x3fffffff)), iVar4 == 0)) break;
            __s_00 = pOVar16[1].z;
            pOVar16 = pOVar16 + 1;
            if (__s_00 == (char *)0x0) goto LAB_002523e4;
          }
          uVar13 = pOVar16->mode;
          if (uVar13 != 0) {
            if ((int)(uVar13 & 0xffffff7f) <= (int)local_54) {
              uVar10 = uVar13 | local_58 & uVar10;
              goto LAB_002523bd;
            }
            pcVar7 = sqlite3_mprintf("%s mode not allowed: %s",pcVar8,pcVar7);
            iVar4 = 3;
            goto LAB_00252074;
          }
        }
LAB_002523e4:
        pcVar7 = sqlite3_mprintf("no such %s mode: %s",pcVar8,pcVar7);
        iVar4 = 1;
        goto LAB_00252074;
      }
    }
    else if (uVar13 == 4) {
      if (*__s_01 == 0x65646f6d) {
        local_54 = uVar10 & 0x87;
        local_58 = 0xffffff78;
        pOVar16 = sqlite3ParseUri::aOpenMode;
        pcVar8 = "access";
        goto LAB_0025233f;
      }
    }
    else if ((uVar13 == 3) && (*(char *)((long)__s_01 + 2) == 's' && (short)*__s_01 == 0x6676)) {
      local_68 = pcVar7;
    }
LAB_002523bd:
    __s_01 = (int *)(pcVar7 + (ulong)(uVar15 & 0x3fffffff) + 1);
    zDefaultVfs = local_68;
  } while ((char)*__s_01 != '\0');
LAB_00252047:
  psVar6 = sqlite3_vfs_find(zDefaultVfs);
  *ppVfs = psVar6;
  iVar4 = 0;
  if (psVar6 != (sqlite3_vfs *)0x0) goto LAB_00252087;
  pcVar7 = sqlite3_mprintf("no such vfs: %s",zDefaultVfs);
LAB_0025206f:
  iVar4 = 1;
LAB_00252074:
  *pzErrMsg = pcVar7;
  sqlite3_free(__s);
  __s = (char *)0x0;
LAB_00252087:
  *pFlags = uVar10;
  *pzFile = __s;
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ParseUri(
  const char *zDefaultVfs,        /* VFS to use if no "vfs=xxx" query option */
  const char *zUri,               /* Nul-terminated URI to parse */
  unsigned int *pFlags,           /* IN/OUT: SQLITE_OPEN_XXX flags */
  sqlite3_vfs **ppVfs,            /* OUT: VFS to use */ 
  char **pzFile,                  /* OUT: Filename component of URI */
  char **pzErrMsg                 /* OUT: Error message (if rc!=SQLITE_OK) */
){
  int rc = SQLITE_OK;
  unsigned int flags = *pFlags;
  const char *zVfs = zDefaultVfs;
  char *zFile;
  char c;
  int nUri = sqlite3Strlen30(zUri);

  assert( *pzErrMsg==0 );

  if( ((flags & SQLITE_OPEN_URI)             /* IMP: R-48725-32206 */
            || sqlite3GlobalConfig.bOpenUri) /* IMP: R-51689-46548 */
   && nUri>=5 && memcmp(zUri, "file:", 5)==0 /* IMP: R-57884-37496 */
  ){
    char *zOpt;
    int eState;                   /* Parser state when parsing URI */
    int iIn;                      /* Input character index */
    int iOut = 0;                 /* Output character index */
    u64 nByte = nUri+2;           /* Bytes of space to allocate */

    /* Make sure the SQLITE_OPEN_URI flag is set to indicate to the VFS xOpen 
    ** method that there may be extra parameters following the file-name.  */
    flags |= SQLITE_OPEN_URI;

    for(iIn=0; iIn<nUri; iIn++) nByte += (zUri[iIn]=='&');
    zFile = sqlite3_malloc64(nByte);
    if( !zFile ) return SQLITE_NOMEM_BKPT;

    iIn = 5;
#ifdef SQLITE_ALLOW_URI_AUTHORITY
    if( strncmp(zUri+5, "///", 3)==0 ){
      iIn = 7;
      /* The following condition causes URIs with five leading / characters
      ** like file://///host/path to be converted into UNCs like //host/path.
      ** The correct URI for that UNC has only two or four leading / characters
      ** file://host/path or file:////host/path.  But 5 leading slashes is a 
      ** common error, we are told, so we handle it as a special case. */
      if( strncmp(zUri+7, "///", 3)==0 ){ iIn++; }
    }else if( strncmp(zUri+5, "//localhost/", 12)==0 ){
      iIn = 16;
    }
#else
    /* Discard the scheme and authority segments of the URI. */
    if( zUri[5]=='/' && zUri[6]=='/' ){
      iIn = 7;
      while( zUri[iIn] && zUri[iIn]!='/' ) iIn++;
      if( iIn!=7 && (iIn!=16 || memcmp("localhost", &zUri[7], 9)) ){
        *pzErrMsg = sqlite3_mprintf("invalid uri authority: %.*s", 
            iIn-7, &zUri[7]);
        rc = SQLITE_ERROR;
        goto parse_uri_out;
      }
    }
#endif

    /* Copy the filename and any query parameters into the zFile buffer. 
    ** Decode %HH escape codes along the way. 
    **
    ** Within this loop, variable eState may be set to 0, 1 or 2, depending
    ** on the parsing context. As follows:
    **
    **   0: Parsing file-name.
    **   1: Parsing name section of a name=value query parameter.
    **   2: Parsing value section of a name=value query parameter.
    */
    eState = 0;
    while( (c = zUri[iIn])!=0 && c!='#' ){
      iIn++;
      if( c=='%' 
       && sqlite3Isxdigit(zUri[iIn]) 
       && sqlite3Isxdigit(zUri[iIn+1]) 
      ){
        int octet = (sqlite3HexToInt(zUri[iIn++]) << 4);
        octet += sqlite3HexToInt(zUri[iIn++]);

        assert( octet>=0 && octet<256 );
        if( octet==0 ){
#ifndef SQLITE_ENABLE_URI_00_ERROR
          /* This branch is taken when "%00" appears within the URI. In this
          ** case we ignore all text in the remainder of the path, name or
          ** value currently being parsed. So ignore the current character
          ** and skip to the next "?", "=" or "&", as appropriate. */
          while( (c = zUri[iIn])!=0 && c!='#' 
              && (eState!=0 || c!='?')
              && (eState!=1 || (c!='=' && c!='&'))
              && (eState!=2 || c!='&')
          ){
            iIn++;
          }
          continue;
#else
          /* If ENABLE_URI_00_ERROR is defined, "%00" in a URI is an error. */
          *pzErrMsg = sqlite3_mprintf("unexpected %%00 in uri");
          rc = SQLITE_ERROR;
          goto parse_uri_out;
#endif
        }
        c = octet;
      }else if( eState==1 && (c=='&' || c=='=') ){
        if( zFile[iOut-1]==0 ){
          /* An empty option name. Ignore this option altogether. */
          while( zUri[iIn] && zUri[iIn]!='#' && zUri[iIn-1]!='&' ) iIn++;
          continue;
        }
        if( c=='&' ){
          zFile[iOut++] = '\0';
        }else{
          eState = 2;
        }
        c = 0;
      }else if( (eState==0 && c=='?') || (eState==2 && c=='&') ){
        c = 0;
        eState = 1;
      }
      zFile[iOut++] = c;
    }
    if( eState==1 ) zFile[iOut++] = '\0';
    zFile[iOut++] = '\0';
    zFile[iOut++] = '\0';

    /* Check if there were any options specified that should be interpreted 
    ** here. Options that are interpreted here include "vfs" and those that
    ** correspond to flags that may be passed to the sqlite3_open_v2()
    ** method. */
    zOpt = &zFile[sqlite3Strlen30(zFile)+1];
    while( zOpt[0] ){
      int nOpt = sqlite3Strlen30(zOpt);
      char *zVal = &zOpt[nOpt+1];
      int nVal = sqlite3Strlen30(zVal);

      if( nOpt==3 && memcmp("vfs", zOpt, 3)==0 ){
        zVfs = zVal;
      }else{
        struct OpenMode {
          const char *z;
          int mode;
        } *aMode = 0;
        char *zModeType = 0;
        int mask = 0;
        int limit = 0;

        if( nOpt==5 && memcmp("cache", zOpt, 5)==0 ){
          static struct OpenMode aCacheMode[] = {
            { "shared",  SQLITE_OPEN_SHAREDCACHE },
            { "private", SQLITE_OPEN_PRIVATECACHE },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_SHAREDCACHE|SQLITE_OPEN_PRIVATECACHE;
          aMode = aCacheMode;
          limit = mask;
          zModeType = "cache";
        }
        if( nOpt==4 && memcmp("mode", zOpt, 4)==0 ){
          static struct OpenMode aOpenMode[] = {
            { "ro",  SQLITE_OPEN_READONLY },
            { "rw",  SQLITE_OPEN_READWRITE }, 
            { "rwc", SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE },
            { "memory", SQLITE_OPEN_MEMORY },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_READONLY | SQLITE_OPEN_READWRITE
                   | SQLITE_OPEN_CREATE | SQLITE_OPEN_MEMORY;
          aMode = aOpenMode;
          limit = mask & flags;
          zModeType = "access";
        }

        if( aMode ){
          int i;
          int mode = 0;
          for(i=0; aMode[i].z; i++){
            const char *z = aMode[i].z;
            if( nVal==sqlite3Strlen30(z) && 0==memcmp(zVal, z, nVal) ){
              mode = aMode[i].mode;
              break;
            }
          }
          if( mode==0 ){
            *pzErrMsg = sqlite3_mprintf("no such %s mode: %s", zModeType, zVal);
            rc = SQLITE_ERROR;
            goto parse_uri_out;
          }
          if( (mode & ~SQLITE_OPEN_MEMORY)>limit ){
            *pzErrMsg = sqlite3_mprintf("%s mode not allowed: %s",
                                        zModeType, zVal);
            rc = SQLITE_PERM;
            goto parse_uri_out;
          }
          flags = (flags & ~mask) | mode;
        }
      }

      zOpt = &zVal[nVal+1];
    }

  }else{
    zFile = sqlite3_malloc64(nUri+2);
    if( !zFile ) return SQLITE_NOMEM_BKPT;
    if( nUri ){
      memcpy(zFile, zUri, nUri);
    }
    zFile[nUri] = '\0';
    zFile[nUri+1] = '\0';
    flags &= ~SQLITE_OPEN_URI;
  }

  *ppVfs = sqlite3_vfs_find(zVfs);
  if( *ppVfs==0 ){
    *pzErrMsg = sqlite3_mprintf("no such vfs: %s", zVfs);
    rc = SQLITE_ERROR;
  }
 parse_uri_out:
  if( rc!=SQLITE_OK ){
    sqlite3_free(zFile);
    zFile = 0;
  }
  *pFlags = flags;
  *pzFile = zFile;
  return rc;
}